

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O2

bool __thiscall
llvm::sys::path::reverse_iterator::operator==(reverse_iterator *this,reverse_iterator *RHS)

{
  bool bVar1;
  
  if ((this->Path).Data != (RHS->Path).Data) {
    return false;
  }
  bVar1 = llvm::operator==(this->Component,RHS->Component);
  if (bVar1) {
    bVar1 = this->Position == RHS->Position;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

iterator begin() const { return Data; }